

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImVec2 new_size;
  float *in_RSI;
  ImVec2 in_RDI;
  bool bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  bool will_have_scrollbar_y;
  bool will_have_scrollbar_x;
  ImVec2 size_auto_fit_after_constraint;
  ImVec2 size_min;
  bool is_menu;
  bool is_popup;
  ImVec2 size_desired;
  ImVec2 size_pad;
  ImVec2 size_decorations;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 size_auto_fit;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  ImVec2 *in_stack_ffffffffffffff40;
  ImVec2 *rhs;
  ImVec2 *in_stack_ffffffffffffff48;
  ImVec2 *lhs;
  ImGuiWindow *in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff58;
  float local_84;
  float fStack_80;
  float fVar6;
  float fVar7;
  float in_stack_ffffffffffffff9c;
  ImVec2 local_54;
  undefined1 local_4a;
  undefined1 local_49;
  ImVec2 local_48;
  ImVec2 local_40;
  float local_38;
  float fStack_34;
  float local_30;
  float local_2c;
  ImGuiStyle *local_28;
  ImGuiContext *local_20;
  float *local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_20 = GImGui;
  local_28 = &GImGui->Style;
  local_18 = in_RSI;
  local_10 = in_RDI;
  fVar3 = ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffff50);
  fVar4 = ImGuiWindow::MenuBarHeight(in_stack_ffffffffffffff50);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,0.0,fVar3 + fVar4);
  _local_38 = operator*((ImVec2 *)
                        CONCAT17(in_stack_ffffffffffffff3f,
                                 CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),0.0)
  ;
  local_48 = operator+((ImVec2 *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       (ImVec2 *)0x1851e2);
  local_40 = operator+((ImVec2 *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       (ImVec2 *)0x1851fd);
  local_8 = local_40;
  if ((*(uint *)((long)local_10 + 0xc) & 0x2000000) == 0) {
    local_49 = (*(uint *)((long)local_10 + 0xc) & 0x4000000) != 0;
    local_4a = (*(uint *)((long)local_10 + 0xc) & 0x10000000) != 0;
    local_54 = local_28->WindowMinSize;
    if (((bool)local_49) || ((bool)local_4a)) {
      in_stack_ffffffffffffff50 = (ImGuiWindow *)&stack0xffffffffffffff9c;
      ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff50,4.0,4.0);
      local_54 = ImMin(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
    rhs = &(local_20->IO).DisplaySize;
    operator*((ImVec2 *)
              CONCAT17(in_stack_ffffffffffffff3f,
                       CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),0.0);
    IVar5 = operator-((ImVec2 *)
                      CONCAT17(in_stack_ffffffffffffff3f,
                               CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                      (ImVec2 *)0x185302);
    fVar4 = IVar5.y;
    lhs = &stack0xffffffffffffffac;
    IVar5 = ImMax(lhs,rhs);
    fVar6 = IVar5.x;
    fVar7 = IVar5.y;
    IVar5.y = fVar3;
    IVar5.x = in_stack_ffffffffffffff58;
    local_8 = ImClamp((ImVec2 *)in_stack_ffffffffffffff50,lhs,IVar5);
    new_size.y = in_stack_ffffffffffffff9c;
    new_size.x = fVar7;
    IVar5 = CalcWindowSizeAfterConstraint((ImGuiWindow *)CONCAT44(fVar6,fVar4),new_size);
    local_84 = IVar5.x;
    if (((*local_18 <= (local_84 - local_38) - local_30) ||
        ((*(uint *)((long)local_10 + 0xc) & 8) != 0)) ||
       (bVar1 = true, (*(uint *)((long)local_10 + 0xc) & 0x800) == 0)) {
      bVar1 = (*(uint *)((long)local_10 + 0xc) & 0x8000) != 0;
    }
    fStack_80 = IVar5.y;
    if ((local_18[1] <= (fStack_80 - fStack_34) - local_2c) ||
       (bVar2 = true, (*(uint *)((long)local_10 + 0xc) & 8) != 0)) {
      bVar2 = (*(uint *)((long)local_10 + 0xc) & 0x4000) != 0;
    }
    if (bVar1) {
      local_8.y = local_28->ScrollbarSize + local_8.y;
    }
    if (bVar2) {
      local_8.x = local_28->ScrollbarSize + local_8.x;
    }
  }
  return local_8;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}